

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_pack_headers
              (nghttp2_bufs *bufs,nghttp2_headers *frame,nghttp2_hd_deflater *deflater)

{
  nghttp2_buf_chain *pnVar1;
  size_t sVar2;
  nghttp2_buf *buf;
  int rv;
  size_t nv_offset;
  nghttp2_hd_deflater *deflater_local;
  nghttp2_headers *frame_local;
  nghttp2_bufs *bufs_local;
  
  if (bufs->head == bufs->cur) {
    sVar2 = nghttp2_frame_headers_payload_nv_offset(frame);
    pnVar1 = bufs->cur;
    (pnVar1->buf).pos = (pnVar1->buf).pos + sVar2;
    (pnVar1->buf).last = (pnVar1->buf).pos;
    buf._4_4_ = nghttp2_hd_deflate_hd_bufs(deflater,bufs,frame->nva,frame->nvlen);
    if (buf._4_4_ == -0x1f6) {
      buf._4_4_ = -0x20b;
    }
    (pnVar1->buf).pos = (pnVar1->buf).pos + -sVar2;
    if (buf._4_4_ == 0) {
      if (((frame->hd).flags & 0x20) != 0) {
        nghttp2_frame_pack_priority_spec((pnVar1->buf).pos,&frame->pri_spec);
      }
      frame->padlen = 0;
      sVar2 = nghttp2_bufs_len(bufs);
      (frame->hd).length = sVar2;
      bufs_local._4_4_ = frame_pack_headers_shared(bufs,&frame->hd);
    }
    else {
      bufs_local._4_4_ = buf._4_4_;
    }
    return bufs_local._4_4_;
  }
  __assert_fail("bufs->head == bufs->cur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x16f,
                "int nghttp2_frame_pack_headers(nghttp2_bufs *, nghttp2_headers *, nghttp2_hd_deflater *)"
               );
}

Assistant:

int nghttp2_frame_pack_headers(nghttp2_bufs *bufs, nghttp2_headers *frame,
                               nghttp2_hd_deflater *deflater) {
  size_t nv_offset;
  int rv;
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  nv_offset = nghttp2_frame_headers_payload_nv_offset(frame);

  buf = &bufs->cur->buf;

  buf->pos += nv_offset;
  buf->last = buf->pos;

  /* This call will adjust buf->last to the correct position */
  rv = nghttp2_hd_deflate_hd_bufs(deflater, bufs, frame->nva, frame->nvlen);

  if (rv == NGHTTP2_ERR_BUFFER_ERROR) {
    rv = NGHTTP2_ERR_HEADER_COMP;
  }

  buf->pos -= nv_offset;

  if (rv != 0) {
    return rv;
  }

  if (frame->hd.flags & NGHTTP2_FLAG_PRIORITY) {
    nghttp2_frame_pack_priority_spec(buf->pos, &frame->pri_spec);
  }

  frame->padlen = 0;
  frame->hd.length = nghttp2_bufs_len(bufs);

  return frame_pack_headers_shared(bufs, &frame->hd);
}